

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslTokenStream.h
# Opt level: O3

void __thiscall
glslang::HlslTokenStream::HlslTokenStream(HlslTokenStream *this,HlslScanContext *scanner)

{
  TPoolAllocator *pTVar1;
  
  this->_vptr_HlslTokenStream = (_func_int **)&PTR__HlslTokenStream_00af7200;
  (this->token).field_2.string = (TString *)0x0;
  (this->token).loc.name = (TString *)0x0;
  (this->token).loc.string = 0;
  (this->token).loc.line = 0;
  (this->token).loc.column = 0;
  this->scanner = scanner;
  (this->tokenStreamStack).
  super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  .
  super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
  (this->tokenStreamStack).
  super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  .
  super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tokenStreamStack).
  super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  .
  super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tokenStreamStack).
  super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  .
  super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar1 = GetThreadPoolAllocator();
  (this->tokenStreamStack).
  super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  .
  super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  ._M_impl.super__Tp_alloc_type.allocator = pTVar1;
  (this->tokenStreamStack).
  super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  .
  super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tokenStreamStack).
  super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  .
  super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tokenStreamStack).
  super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  .
  super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
  super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Tp_alloc_type.allocator =
       (TPoolAllocator *)0x0;
  (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
  super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
  super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
  super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pTVar1 = GetThreadPoolAllocator();
  (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
  super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Tp_alloc_type.allocator =
       pTVar1;
  (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
  super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
  super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
  super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->currentTokenStack).
  super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
  super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
  super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
  (this->currentTokenStack).
  super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
  super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->currentTokenStack).
  super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
  super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->currentTokenStack).
  super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
  super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar1 = GetThreadPoolAllocator();
  (this->currentTokenStack).
  super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
  super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
  super__Tp_alloc_type.allocator = pTVar1;
  this->preTokenStack[1].field_2.string = (TString *)0x0;
  this->preTokenStackSize = 0;
  this->tokenBuffer[0].loc.name = (TString *)0x0;
  this->tokenBuffer[0].loc.string = 0;
  this->tokenBuffer[0].loc.line = 0;
  this->tokenBuffer[0].loc.column = 0;
  this->tokenBuffer[1].field_2.string = (TString *)0x0;
  this->tokenBufferPos = 0;
  (this->currentTokenStack).
  super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
  super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->currentTokenStack).
  super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
  super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->currentTokenStack).
  super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
  super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->preTokenStack[0].loc.name = (TString *)0x0;
  *(undefined8 *)((long)&this->preTokenStack[0].loc.name + 4) = 0;
  this->preTokenStack[0].loc.line = 0;
  this->preTokenStack[0].loc.column = 0;
  this->preTokenStack[0].field_2.string = (TString *)0x0;
  this->preTokenStack[1].loc.name = (TString *)0x0;
  *(undefined8 *)((long)&this->preTokenStack[1].loc.name + 4) = 0;
  this->preTokenStack[1].loc.line = 0;
  this->preTokenStack[1].loc.column = 0;
  this->tokenBuffer[0].field_2.string = (TString *)0x0;
  this->tokenBuffer[1].loc.name = (TString *)0x0;
  *(undefined8 *)((long)&this->tokenBuffer[1].loc.name + 4) = 0;
  this->tokenBuffer[1].loc.line = 0;
  this->tokenBuffer[1].loc.column = 0;
  return;
}

Assistant:

explicit HlslTokenStream(HlslScanContext& scanner)
            : scanner(scanner), preTokenStackSize(0), tokenBufferPos(0) { }